

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O0

void __thiscall Diligent::DeviceContextGLImpl::WaitForIdle(DeviceContextGLImpl *this)

{
  bool bVar1;
  Char *Message;
  undefined1 local_30 [8];
  string msg;
  DeviceContextGLImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = DeviceContextBase<Diligent::EngineGLImplTraits>::IsDeferred
                    (&this->super_DeviceContextBase<Diligent::EngineGLImplTraits>);
  if (bVar1) {
    FormatString<char[37]>((string *)local_30,(char (*) [37])"Only immediate contexts can be idled")
    ;
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"WaitForIdle",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
               ,0x633);
    std::__cxx11::string::~string((string *)local_30);
  }
  Flush(this);
  glFinish();
  return;
}

Assistant:

void DeviceContextGLImpl::WaitForIdle()
{
    DEV_CHECK_ERR(!IsDeferred(), "Only immediate contexts can be idled");
    Flush();
    glFinish();
}